

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O2

pcp_errno parse_response(pcp_recv_msg_t *f)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint8_t uVar5;
  undefined8 uVar6;
  uint8_t uVar7;
  pcp_errno pVar8;
  ulong uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  
  bVar1 = f->pcp_msg_buffer[0];
  bVar2 = f->pcp_msg_buffer[1];
  pVar8 = (uint)bVar2 & 0x7f;
  f->recv_version = (uint)bVar1;
  f->recv_result = (uint)(byte)f->pcp_msg_buffer[3];
  *(undefined8 *)&f->kd = 0;
  *(undefined8 *)((long)&(f->kd).src_ip.__in6_u + 4) = 0;
  *(undefined8 *)((long)&(f->kd).src_ip.__in6_u + 0xc) = 0;
  *(undefined8 *)((long)&(f->kd).pcp_server_ip.__in6_u + 4) = 0;
  *(undefined8 *)((long)&(f->kd).pcp_server_ip.__in6_u + 0xc) = 0;
  (f->kd).nonce.n[0] = 0;
  (f->kd).nonce.n[1] = 0;
  *(undefined8 *)((f->kd).nonce.n + 2) = 0;
  *(undefined8 *)((long)&(f->kd).field_5 + 4) = 0;
  *(undefined8 *)((long)&(f->kd).field_5 + 8) = 0;
  *(undefined8 *)((long)&(f->kd).field_5 + 0x10) = 0;
  uVar7 = (uint8_t)pVar8;
  (f->kd).operation = uVar7;
  if (bVar1 == 2) {
    uVar9 = (ulong)f->pcp_msg_len;
    if (uVar9 < 0x18) {
      return PCP_ERR_RECV_FAILED;
    }
    uVar3 = *(uint *)(f->pcp_msg_buffer + 4);
    uVar4 = *(uint *)(f->pcp_msg_buffer + 8);
    f->recv_lifetime =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    f->recv_epoch = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    switch(pVar8) {
    default:
      return pVar8;
    case ~PCP_ERR_OPT_ALREADY_PRESENT:
      if (uVar9 - 0x18 < 0x24) {
        return PCP_ERR_RECV_FAILED;
      }
      (f->kd).nonce.n[2] = *(uint32_t *)(f->pcp_msg_buffer + 0x20);
      *(undefined8 *)(f->kd).nonce.n = *(undefined8 *)(f->pcp_msg_buffer + 0x18);
      (f->kd).field_5.map_peer.src_port = *(uint16_t *)(f->pcp_msg_buffer + 0x28);
      (f->kd).field_5.map_peer.protocol = f->pcp_msg_buffer[0x24];
      f->assigned_ext_port = *(uint16_t *)(f->pcp_msg_buffer + 0x2a);
      break;
    case ~PCP_ERR_BAD_AFINET:
      if (uVar9 - 0x18 < 0x38) {
        return PCP_ERR_RECV_FAILED;
      }
      (f->kd).nonce.n[2] = *(uint32_t *)(f->pcp_msg_buffer + 0x20);
      *(undefined8 *)(f->kd).nonce.n = *(undefined8 *)(f->pcp_msg_buffer + 0x18);
      (f->kd).field_5.map_peer.src_port = *(uint16_t *)(f->pcp_msg_buffer + 0x28);
      (f->kd).field_5.map_peer.protocol = f->pcp_msg_buffer[0x24];
      (f->kd).field_5.map_peer.dst_port = *(uint16_t *)(f->pcp_msg_buffer + 0x3c);
      f->assigned_ext_port = *(uint16_t *)(f->pcp_msg_buffer + 0x2a);
      uVar6 = *(undefined8 *)(f->pcp_msg_buffer + 0x48);
      *(undefined8 *)((long)&(f->kd).field_5 + 4) = *(undefined8 *)(f->pcp_msg_buffer + 0x40);
      *(undefined8 *)((long)&(f->kd).field_5 + 0xc) = uVar6;
      break;
    case ~PCP_ERR_SEND_FAILED:
      if (uVar9 - 0x18 < 0x10) {
        return PCP_ERR_RECV_FAILED;
      }
      (f->kd).nonce.n[2] = *(uint32_t *)(f->pcp_msg_buffer + 0x20);
      *(undefined8 *)(f->kd).nonce.n = *(undefined8 *)(f->pcp_msg_buffer + 0x18);
      f->recv_dscp = f->pcp_msg_buffer[0x24] & 0x3f;
      return PCP_ERR_SUCCESS;
    }
    uVar10 = *(uint32_t *)(f->pcp_msg_buffer + 0x2c);
    uVar11 = *(uint32_t *)(f->pcp_msg_buffer + 0x30);
    uVar12 = *(uint32_t *)(f->pcp_msg_buffer + 0x34);
    uVar13 = *(uint32_t *)(f->pcp_msg_buffer + 0x38);
  }
  else {
    if (bVar1 != 1) {
      if (bVar1 != 0) {
        return PCP_ERR_UNSUP_VERSION;
      }
      if ((uint)(pVar8 + PCP_ERR_MAX_SIZE) < 2) {
        uVar10 = f->pcp_msg_len;
        if (uVar10 == 0x10) {
          f->assigned_ext_port = *(uint16_t *)(f->pcp_msg_buffer + 10);
          (f->kd).field_5.map_peer.src_port = *(uint16_t *)(f->pcp_msg_buffer + 8);
          uVar3 = *(uint *)(f->pcp_msg_buffer + 4);
          f->recv_epoch =
               uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
          uVar3 = *(uint *)(f->pcp_msg_buffer + 0xc);
          f->recv_lifetime =
               uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
          uVar5 = '\x11';
          if (uVar7 == '\x02') {
            uVar5 = '\x06';
          }
          f->recv_result =
               (uint)(ushort)(*(ushort *)(f->pcp_msg_buffer + 2) << 8 |
                             *(ushort *)(f->pcp_msg_buffer + 2) >> 8);
          (f->kd).field_5.map_peer.protocol = uVar5;
          (f->kd).operation = '\x01';
          return PCP_ERR_SUCCESS;
        }
      }
      else if ((bVar2 & 0x7f) == 0) {
        uVar10 = f->pcp_msg_len;
        if (uVar10 == 0xc) {
          uVar3 = *(uint *)(f->pcp_msg_buffer + 4);
          uVar10 = *(uint32_t *)(f->pcp_msg_buffer + 8);
          f->recv_epoch =
               uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
          *(undefined8 *)&(f->assigned_ext_ip).__in6_u = 0;
          (f->assigned_ext_ip).__in6_u.__u6_addr32[2] = 0xffff0000;
          (f->assigned_ext_ip).__in6_u.__u6_addr32[3] = uVar10;
          return PCP_ERR_SUCCESS;
        }
      }
      else {
        uVar10 = f->pcp_msg_len;
      }
      if (uVar10 == 8) {
        f->recv_result =
             (uint)(ushort)(*(ushort *)(f->pcp_msg_buffer + 2) << 8 |
                           *(ushort *)(f->pcp_msg_buffer + 2) >> 8);
        uVar3 = *(uint *)(f->pcp_msg_buffer + 4);
        f->recv_epoch =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        return PCP_ERR_SUCCESS;
      }
      return PCP_ERR_RECV_FAILED;
    }
    uVar9 = (ulong)f->pcp_msg_len;
    if (uVar9 < 0x18) {
      return PCP_ERR_RECV_FAILED;
    }
    uVar3 = *(uint *)(f->pcp_msg_buffer + 4);
    uVar4 = *(uint *)(f->pcp_msg_buffer + 8);
    f->recv_lifetime =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    f->recv_epoch = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    if (uVar7 == '\0') {
      return pVar8;
    }
    if (pVar8 == ~PCP_ERR_BAD_AFINET) {
      if (uVar9 - 0x18 < 0x2c) {
        return PCP_ERR_RECV_FAILED;
      }
      (f->kd).field_5.map_peer.src_port = *(uint16_t *)(f->pcp_msg_buffer + 0x1c);
      (f->kd).field_5.map_peer.protocol = f->pcp_msg_buffer[0x18];
      (f->kd).field_5.map_peer.dst_port = *(uint16_t *)(f->pcp_msg_buffer + 0x30);
      f->assigned_ext_port = *(uint16_t *)(f->pcp_msg_buffer + 0x1e);
      uVar6 = *(undefined8 *)(f->pcp_msg_buffer + 0x3c);
      *(undefined8 *)((long)&(f->kd).field_5 + 4) = *(undefined8 *)(f->pcp_msg_buffer + 0x34);
      *(undefined8 *)((long)&(f->kd).field_5 + 0xc) = uVar6;
    }
    else {
      if (pVar8 != ~PCP_ERR_OPT_ALREADY_PRESENT) {
        return PCP_ERR_RECV_FAILED;
      }
      if (uVar9 - 0x18 < 0x18) {
        return PCP_ERR_RECV_FAILED;
      }
      (f->kd).field_5.map_peer.src_port = *(uint16_t *)(f->pcp_msg_buffer + 0x1c);
      (f->kd).field_5.map_peer.protocol = f->pcp_msg_buffer[0x18];
      f->assigned_ext_port = *(uint16_t *)(f->pcp_msg_buffer + 0x1e);
    }
    uVar10 = *(uint32_t *)(f->pcp_msg_buffer + 0x20);
    uVar11 = *(uint32_t *)(f->pcp_msg_buffer + 0x24);
    uVar12 = *(uint32_t *)(f->pcp_msg_buffer + 0x28);
    uVar13 = *(uint32_t *)(f->pcp_msg_buffer + 0x2c);
  }
  (f->assigned_ext_ip).__in6_u.__u6_addr32[0] = uVar10;
  (f->assigned_ext_ip).__in6_u.__u6_addr32[1] = uVar11;
  (f->assigned_ext_ip).__in6_u.__u6_addr32[2] = uVar12;
  (f->assigned_ext_ip).__in6_u.__u6_addr32[3] = uVar13;
  return PCP_ERR_SUCCESS;
}

Assistant:

pcp_errno parse_response(pcp_recv_msg_t *f) {
    pcp_response_t *resp = (pcp_response_t *)f->pcp_msg_buffer;

    f->recv_version = resp->ver;
    f->recv_result = resp->result_code;
    memset(&f->kd, 0, sizeof(f->kd));

    f->kd.operation = resp->r_opcode & 0x7f;

    PCP_LOG(PCP_LOGLVL_DEBUG, "parse_response: version: %d", f->recv_version);
    PCP_LOG(PCP_LOGLVL_DEBUG, "parse_response: result: %d", f->recv_result);

    switch (f->recv_version) {
#ifndef PCP_DISABLE_NATPMP
    case 0:
        return parse_v0_resp(f, resp);
        break;
#endif
    case 1:
        return parse_v1_resp(f, resp);
        break;
    case 2:
        return parse_v2_resp(f, resp);
        break;
    }
    return PCP_ERR_UNSUP_VERSION;
}